

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

deUint32 __thiscall
sglr::ReferenceContext::checkFramebufferStatus(ReferenceContext *this,deUint32 target)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  int *piVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ChannelOrder CVar7;
  ChannelType CVar8;
  long lVar9;
  ChannelOrder CVar10;
  deUint32 dVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  TextureFormat *pTVar14;
  TestError *this_00;
  long lVar15;
  _Base_ptr p_Var16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  long lVar20;
  ChannelOrder CVar21;
  Texture2D *tex2D;
  bool bVar22;
  ChannelType local_70;
  undefined1 local_58 [12];
  ChannelType CStack_4c;
  TextureFormat local_48;
  TextureFormat TStack_40;
  TextureFormat local_38;
  
  if ((target - 0x8ca8 < 2) || (target == 0x8d40)) {
    lVar15 = 0x3f40;
    if (target != 0x8d40) {
      lVar15 = (ulong)(target == 0x8ca9) * 8 + 0x3f38;
    }
    lVar15 = *(long *)((long)(this->m_defaultColorbuffer).m_access.super_ConstPixelBufferAccess.
                             m_size.m_data + lVar15 + -0x70);
    if (lVar15 == 0) {
      dVar11 = 0x8cd5;
    }
    else {
      p_Var1 = &(this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = &(this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header;
      bVar18 = true;
      CVar21 = ~R;
      lVar20 = 0;
      local_70 = ~SNORM_INT8;
      bVar19 = false;
      bVar17 = 1;
      do {
        piVar3 = (int *)(lVar15 + 0x10 + lVar20 * 0x14);
        iVar5 = *piVar3;
        if (iVar5 == 0) {
          p_Var16 = (this->m_renderbuffers).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          if (p_Var16 != (_Base_ptr)0x0) {
            uVar6 = piVar3[1];
            p_Var12 = &p_Var1->_M_header;
            do {
              bVar22 = (uint)*(size_t *)(p_Var16 + 1) < uVar6;
              if (!bVar22) {
                p_Var12 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[bVar22];
            } while (p_Var16 != (_Base_ptr)0x0);
            if ((((_Rb_tree_header *)p_Var12 != p_Var1) &&
                ((uint)((_Rb_tree_header *)p_Var12)->_M_node_count <= uVar6)) &&
               (lVar9 = *(long *)((long)p_Var12 + 0x28), lVar9 != 0)) {
              CVar7 = *(ChannelOrder *)(lVar9 + 0x18);
              CVar8 = *(ChannelType *)(lVar9 + 0x1c);
              CVar10 = (ChannelOrder)*(undefined8 *)(lVar9 + 0x10);
LAB_018a8a48:
              if ((((int)CVar8 < 1) || ((int)CVar7 < 1)) || (bVar19)) {
                bVar17 = bVar17 & (CVar8 == local_70 && CVar7 == CVar21);
              }
              else {
                bVar19 = true;
                CVar21 = CVar7;
                local_70 = CVar8;
              }
              switch(CVar10) {
              case R:
              case RG:
              case RGB:
              case RGBA:
              case sRGB:
              case sRGBA:
                bVar22 = lVar20 == 0;
                break;
              default:
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_00,"Unsupported attachment channel order",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                           ,0x8f0);
                goto LAB_018a8b9a;
              case D:
                bVar22 = lVar20 == 1;
                break;
              case S:
                bVar22 = lVar20 == 2;
                break;
              case DS:
                bVar22 = (int)lVar20 - 1U < 2;
              }
              bVar18 = (bool)(bVar18 & bVar22);
              goto LAB_018a8a8e;
            }
          }
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,(char *)0x0,"renderbuffer",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0x8bd);
          goto LAB_018a8b9a;
        }
        if (iVar5 != 2) {
          if (iVar5 != 1) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"attachment.type == Framebuffer::ATTACHMENTTYPE_LAST",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                       ,0x8c5);
            goto LAB_018a8b9a;
          }
          p_Var16 = (this->m_textures).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          if (p_Var16 == (_Base_ptr)0x0) {
LAB_018a8b38:
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_58);
          }
          else {
            uVar6 = piVar3[1];
            p_Var12 = &p_Var2->_M_header;
            do {
              bVar22 = (uint)*(size_t *)(p_Var16 + 1) < uVar6;
              if (!bVar22) {
                p_Var12 = p_Var16;
              }
              p_Var16 = (&p_Var16->_M_left)[bVar22];
            } while (p_Var16 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var12 == p_Var2) ||
               (uVar6 < (uint)((_Rb_tree_header *)p_Var12)->_M_node_count)) goto LAB_018a8b38;
            lVar9 = *(long *)((long)p_Var12 + 0x28);
            tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_58);
            if (lVar9 != 0) {
              uVar6 = piVar3[2];
              if ((long)(int)uVar6 == 0) {
LAB_018a8923:
                uVar13 = (ulong)(uint)piVar3[3];
                if ((uVar13 < 0xe) && (*(long *)(lVar9 + 0x68 + uVar13 * 0x10) != 0)) {
                  lVar4 = uVar13 * 0x28 + 0x140;
LAB_018a89fb:
                  pTVar14 = (TextureFormat *)(lVar4 + lVar9);
                  local_38 = pTVar14[4];
                  local_58._0_8_ = *pTVar14;
                  unique0x1000027d = pTVar14[1];
                  local_48 = pTVar14[2];
                  TStack_40 = pTVar14[3];
                }
              }
              else {
                if (6 < uVar6) {
                  if (((uVar6 != 9) && (uVar6 != 8)) && (uVar6 != 7)) {
                    this_00 = (TestError *)__cxa_allocate_exception(0x38);
                    tcu::TestError::TestError
                              (this_00,
                               "Framebuffer attached to a texture but no valid target specified",
                               (char *)0x0,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                               ,0x8b4);
                    goto LAB_018a8b9a;
                  }
                  goto LAB_018a8923;
                }
                uVar13 = (ulong)(uint)piVar3[3];
                if ((uVar13 < 0xe) &&
                   (*(long *)(lVar9 + (*(long *)(&DAT_01cbe1c0 + (long)(int)uVar6 * 8) * 0x2a + 3) *
                                      0x20 + 8 + uVar13 * 0x10) != 0)) {
                  lVar4 = uVar13 * 0x28 +
                          *(long *)(&DAT_01cbe1c0 + (long)(int)uVar6 * 8) * 0x540 + 0x140;
                  goto LAB_018a89fb;
                }
              }
              CVar10 = (ChannelOrder)local_58._0_8_;
              CVar7 = local_58._8_4_;
              CVar8 = CStack_4c;
              goto LAB_018a8a48;
            }
          }
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,(char *)0x0,"texture",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                     ,0x885);
LAB_018a8b9a:
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
LAB_018a8a8e:
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      dVar11 = 0x8cd6;
      if (bVar18) {
        dVar11 = 0x8cd7;
        if (bVar19) {
          dVar11 = ((byte)~bVar17 & 1) * 4 + 0x8cd5;
        }
      }
    }
  }
  else {
    dVar11 = 0;
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
      dVar11 = 0;
    }
  }
  return dVar11;
}

Assistant:

deUint32 ReferenceContext::checkFramebufferStatus (deUint32 target)
{
	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, 0);

	// Select binding point.
	rc::Framebuffer* framebufferBinding = (target == GL_FRAMEBUFFER || target == GL_DRAW_FRAMEBUFFER) ? m_drawFramebufferBinding : m_readFramebufferBinding;

	// Default framebuffer is always complete.
	if (!framebufferBinding)
		return GL_FRAMEBUFFER_COMPLETE;

	int		width				= -1;
	int		height				= -1;
	bool	hasAttachment		= false;
	bool	attachmentComplete	= true;
	bool	dimensionsOk		= true;

	for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
	{
		const Framebuffer::Attachment&	attachment			= framebufferBinding->getAttachment((Framebuffer::AttachmentPoint)point);
		int								attachmentWidth		= 0;
		int								attachmentHeight	= 0;
		tcu::TextureFormat				attachmentFormat;

		if (attachment.type == Framebuffer::ATTACHMENTTYPE_TEXTURE)
		{
			const Texture*					texture	= m_textures.find(attachment.name);
			tcu::ConstPixelBufferAccess		level;
			TCU_CHECK(texture);

			if (attachment.texTarget == Framebuffer::TEXTARGET_2D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D);
				const Texture2D* tex2D = static_cast<const Texture2D*>(texture);

				if (tex2D->hasLevel(attachment.level))
					level = tex2D->getLevel(attachment.level);
			}
			else if (deInRange32(attachment.texTarget, Framebuffer::TEXTARGET_CUBE_MAP_POSITIVE_X,
													   Framebuffer::TEXTARGET_CUBE_MAP_NEGATIVE_Z))
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP);

				const TextureCube*	texCube	= static_cast<const TextureCube*>(texture);
				const tcu::CubeFace	face	= texTargetToFace(attachment.texTarget);
				TCU_CHECK(de::inBounds<int>(face, 0, tcu::CUBEFACE_LAST));

				if (texCube->hasFace(attachment.level, face))
					level = texCube->getFace(attachment.level, face);
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_2D_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_2D_ARRAY);
				const Texture2DArray* tex2DArr = static_cast<const Texture2DArray*>(texture);

				if (tex2DArr->hasLevel(attachment.level))
					level = tex2DArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_3D)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_3D);
				const Texture3D* tex3D = static_cast<const Texture3D*>(texture);

				if (tex3D->hasLevel(attachment.level))
					level = tex3D->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else if (attachment.texTarget == Framebuffer::TEXTARGET_CUBE_MAP_ARRAY)
			{
				DE_ASSERT(texture->getType() == Texture::TYPE_CUBE_MAP_ARRAY);
				const TextureCubeArray* texCubeArr = static_cast<const TextureCubeArray*>(texture);

				if (texCubeArr->hasLevel(attachment.level))
					level = texCubeArr->getLevel(attachment.level); // \note Slice doesn't matter here.
			}
			else
				TCU_FAIL("Framebuffer attached to a texture but no valid target specified");

			attachmentWidth		= level.getWidth();
			attachmentHeight	= level.getHeight();
			attachmentFormat	= level.getFormat();
		}
		else if (attachment.type == Framebuffer::ATTACHMENTTYPE_RENDERBUFFER)
		{
			const Renderbuffer* renderbuffer = m_renderbuffers.find(attachment.name);
			TCU_CHECK(renderbuffer);

			attachmentWidth		= renderbuffer->getWidth();
			attachmentHeight	= renderbuffer->getHeight();
			attachmentFormat	= renderbuffer->getFormat();
		}
		else
		{
			TCU_CHECK(attachment.type == Framebuffer::ATTACHMENTTYPE_LAST);
			continue; // Skip rest of checks.
		}

		if (!hasAttachment && attachmentWidth > 0 && attachmentHeight > 0)
		{
			width			= attachmentWidth;
			height			= attachmentHeight;
			hasAttachment	= true;
		}
		else if (attachmentWidth != width || attachmentHeight != height)
			dimensionsOk = false;

		// Validate attachment point compatibility.
		switch (attachmentFormat.order)
		{
			case TextureFormat::R:
			case TextureFormat::RG:
			case TextureFormat::RGB:
			case TextureFormat::RGBA:
			case TextureFormat::sRGB:
			case TextureFormat::sRGBA:
				if (point != Framebuffer::ATTACHMENTPOINT_COLOR0)
					attachmentComplete = false;
				break;

			case TextureFormat::D:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH)
					attachmentComplete = false;
				break;

			case TextureFormat::S:
				if (point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			case TextureFormat::DS:
				if (point != Framebuffer::ATTACHMENTPOINT_DEPTH &&
					point != Framebuffer::ATTACHMENTPOINT_STENCIL)
					attachmentComplete = false;
				break;

			default:
				TCU_FAIL("Unsupported attachment channel order");
		}
	}

	if (!attachmentComplete)
		return GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT;
	else if (!hasAttachment)
		return GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT;
	else if (!dimensionsOk)
		return GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS;
	else
		return GL_FRAMEBUFFER_COMPLETE;
}